

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.cpp
# Opt level: O1

void duckdb::BitStringFunction<true>(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  VectorType VVar2;
  VectorType VVar3;
  int iVar4;
  unsigned_long *puVar5;
  anon_union_16_2_67f50693_for_value *paVar6;
  int *piVar7;
  sel_t *psVar8;
  sel_t *psVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar10;
  element_type *peVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  reference vector;
  reference vector_00;
  idx_t iVar13;
  TemplatedValidityData<unsigned_long> *pTVar14;
  ulong uVar15;
  idx_t iVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  idx_t iVar20;
  unsigned_long uVar21;
  data_ptr_t pdVar22;
  ValidityMask *in_R8;
  idx_t in_R9;
  idx_t idx_in_entry;
  ulong uVar23;
  data_ptr_t pdVar24;
  ulong uVar25;
  data_ptr_t pdVar26;
  idx_t count;
  anon_struct_16_3_d7536bce_for_pointer aVar27;
  string_t sVar28;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  UnifiedVectorFormat ldata;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  idx_t local_c8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  VVar2 = vector->vector_type;
  VVar3 = vector_00->vector_type;
  if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    paVar6 = (anon_union_16_2_67f50693_for_value *)result->data;
    if (((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) &&
       ((puVar5 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar5 == (unsigned_long *)0x0 || ((*puVar5 & 1) != 0)))) {
      aVar27 = (anon_struct_16_3_d7536bce_for_pointer)
               BinaryLambdaWrapper::
               Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                         ((anon_class_8_1_6971b95b)result,
                          (string_t)((anon_union_16_2_67f50693_for_value *)vector->data)->pointer,
                          *(int *)vector_00->data,in_R8,in_R9);
      paVar6->pointer = aVar27;
      return;
    }
  }
  else {
    count = args->count;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
      pdVar24 = vector->data;
      piVar7 = (int *)vector_00->data;
      puVar5 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar22 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (count == 0) {
            return;
          }
          iVar4 = *piVar7;
          lVar19 = 8;
          do {
            left_02.value.pointer.ptr = (char *)*(undefined8 *)(pdVar24 + lVar19);
            left_02.value._0_8_ = *(undefined8 *)(pdVar24 + lVar19 + -8);
            sVar28 = BinaryLambdaWrapper::
                     Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,left_02,iVar4,in_R8,in_R9);
            *(long *)(pdVar22 + lVar19 + -8) = sVar28.value._0_8_;
            *(long *)(pdVar22 + lVar19) = sVar28.value._8_8_;
            lVar19 = lVar19 + 0x10;
            count = count - 1;
          } while (count != 0);
          return;
        }
        if (count + 0x3f < 0x40) {
          return;
        }
        uVar15 = 0;
        uVar23 = 0;
        do {
          puVar5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            uVar21 = 0xffffffffffffffff;
          }
          else {
            uVar21 = puVar5[uVar15];
          }
          uVar17 = uVar23 + 0x40;
          if (count <= uVar23 + 0x40) {
            uVar17 = count;
          }
          uVar18 = uVar17;
          if (uVar21 != 0) {
            uVar18 = uVar23;
            if (uVar21 == 0xffffffffffffffff) {
              if (uVar23 < uVar17) {
                iVar4 = *piVar7;
                uVar25 = uVar23 << 4 | 8;
                do {
                  left.value.pointer.ptr = (char *)*(undefined8 *)(pdVar24 + uVar25);
                  left.value._0_8_ = *(undefined8 *)(pdVar24 + (uVar25 - 8));
                  sVar28 = BinaryLambdaWrapper::
                           Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,left,iVar4,in_R8,in_R9);
                  *(long *)(pdVar22 + (uVar25 - 8)) = sVar28.value._0_8_;
                  *(long *)(pdVar22 + uVar25) = sVar28.value._8_8_;
                  uVar23 = uVar23 + 1;
                  uVar25 = uVar25 + 0x10;
                  uVar18 = uVar23;
                } while (uVar17 != uVar23);
              }
            }
            else if (uVar23 < uVar17) {
              uVar18 = uVar23 << 4 | 8;
              uVar25 = 0;
              do {
                if ((uVar21 >> (uVar25 & 0x3f) & 1) != 0) {
                  left_00.value.pointer.ptr = (char *)*(undefined8 *)(pdVar24 + uVar18);
                  left_00.value._0_8_ = *(undefined8 *)(pdVar24 + (uVar18 - 8));
                  sVar28 = BinaryLambdaWrapper::
                           Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,left_00,*piVar7,in_R8,in_R9);
                  *(long *)(pdVar22 + (uVar18 - 8)) = sVar28.value._0_8_;
                  *(long *)(pdVar22 + uVar18) = sVar28.value._8_8_;
                }
                uVar25 = uVar25 + 1;
                uVar18 = uVar18 + 0x10;
              } while ((uVar23 - uVar17) + uVar25 != 0);
              uVar18 = uVar23 + uVar25;
            }
          }
          uVar15 = uVar15 + 1;
          uVar23 = uVar18;
        } while (uVar15 != count + 0x3f >> 6);
        return;
      }
    }
    else {
      if ((VVar2 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
          pdVar24 = vector->data;
          pdVar22 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar26 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(&result->validity,&vector_00->validity,count);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != 0) {
              lVar19 = 0;
              do {
                sVar28.value.pointer.ptr = (char *)*(undefined8 *)(pdVar24 + lVar19 * 4 + 8);
                sVar28.value._0_8_ = *(undefined8 *)(pdVar24 + lVar19 * 4);
                sVar28 = BinaryLambdaWrapper::
                         Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,sVar28,
                                    *(int *)(pdVar22 + lVar19),in_R8,in_R9);
                *(long *)(pdVar26 + lVar19 * 4) = sVar28.value._0_8_;
                *(long *)(pdVar26 + lVar19 * 4 + 8) = sVar28.value._8_8_;
                lVar19 = lVar19 + 4;
                count = count - 1;
              } while (count != 0);
            }
          }
          else if (0x3f < count + 0x3f) {
            uVar15 = 0;
            uVar23 = 0;
            do {
              puVar5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                uVar21 = 0xffffffffffffffff;
              }
              else {
                uVar21 = puVar5[uVar15];
              }
              uVar17 = uVar23 + 0x40;
              if (count <= uVar23 + 0x40) {
                uVar17 = count;
              }
              uVar18 = uVar17;
              if (uVar21 != 0) {
                uVar18 = uVar23;
                if (uVar21 == 0xffffffffffffffff) {
                  if (uVar23 < uVar17) {
                    lVar19 = uVar23 * 4 + 2;
                    do {
                      left_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar24 + lVar19 * 4);
                      left_03.value._0_8_ = *(undefined8 *)(pdVar24 + lVar19 * 4 + -8);
                      sVar28 = BinaryLambdaWrapper::
                               Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                         ((anon_class_8_1_6971b95b)result,left_03,
                                          *(int *)(pdVar22 + uVar23 * 4),in_R8,in_R9);
                      *(long *)(pdVar26 + lVar19 * 4 + -8) = sVar28.value._0_8_;
                      *(long *)(pdVar26 + lVar19 * 4) = sVar28.value._8_8_;
                      uVar23 = uVar23 + 1;
                      lVar19 = lVar19 + 4;
                      uVar18 = uVar23;
                    } while (uVar17 != uVar23);
                  }
                }
                else if (uVar23 < uVar17) {
                  lVar19 = uVar23 * 4 + 2;
                  uVar18 = 0;
                  do {
                    if ((uVar21 >> (uVar18 & 0x3f) & 1) != 0) {
                      left_04.value.pointer.ptr = (char *)*(undefined8 *)(pdVar24 + lVar19 * 4);
                      left_04.value._0_8_ = *(undefined8 *)(pdVar24 + lVar19 * 4 + -8);
                      sVar28 = BinaryLambdaWrapper::
                               Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                         ((anon_class_8_1_6971b95b)result,left_04,
                                          *(int *)(pdVar22 + uVar18 * 4 + uVar23 * 4),in_R8,in_R9);
                      *(long *)(pdVar26 + lVar19 * 4 + -8) = sVar28.value._0_8_;
                      *(long *)(pdVar26 + lVar19 * 4) = sVar28.value._8_8_;
                    }
                    uVar18 = uVar18 + 1;
                    lVar19 = lVar19 + 4;
                  } while ((uVar23 - uVar17) + uVar18 != 0);
                  uVar18 = uVar23 + uVar18;
                }
              }
              uVar15 = uVar15 + 1;
              uVar23 = uVar18;
            } while (uVar15 != count + 0x3f >> 6);
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
          Vector::ToUnifiedFormat(vector,count,&local_78);
          Vector::ToUnifiedFormat(vector_00,count,&local_c0);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar24 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != 0) {
              psVar8 = (local_78.sel)->sel_vector;
              psVar9 = (local_c0.sel)->sel_vector;
              pdVar24 = pdVar24 + 8;
              iVar20 = 0;
              do {
                iVar13 = iVar20;
                if (psVar8 != (sel_t *)0x0) {
                  iVar13 = (idx_t)psVar8[iVar20];
                }
                iVar16 = iVar20;
                if (psVar9 != (sel_t *)0x0) {
                  iVar16 = (idx_t)psVar9[iVar20];
                }
                left_01.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_78.data + iVar13 * 0x10 + 8);
                left_01.value._0_8_ = *(undefined8 *)(local_78.data + iVar13 * 0x10);
                sVar28 = BinaryLambdaWrapper::
                         Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_01,
                                    *(int *)(local_c0.data + iVar16 * 4),in_R8,in_R9);
                *(long *)(pdVar24 + -8) = sVar28.value._0_8_;
                *(long *)pdVar24 = sVar28.value._8_8_;
                iVar20 = iVar20 + 1;
                pdVar24 = pdVar24 + 0x10;
              } while (count != iVar20);
            }
          }
          else if (count != 0) {
            psVar8 = (local_78.sel)->sel_vector;
            psVar9 = (local_c0.sel)->sel_vector;
            pdVar24 = pdVar24 + 8;
            uVar23 = 0;
            do {
              uVar15 = uVar23;
              if (psVar8 != (sel_t *)0x0) {
                uVar15 = (ulong)psVar8[uVar23];
              }
              uVar17 = uVar23;
              if (psVar9 != (sel_t *)0x0) {
                uVar17 = (ulong)psVar9[uVar23];
              }
              if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0)) &&
                 ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0)))) {
                left_05.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_78.data + uVar15 * 0x10 + 8);
                left_05.value._0_8_ = *(undefined8 *)(local_78.data + uVar15 * 0x10);
                sVar28 = BinaryLambdaWrapper::
                         Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_05,
                                    *(int *)(local_c0.data + uVar17 * 4),in_R8,in_R9);
                *(long *)(pdVar24 + -8) = sVar28.value._0_8_;
                *(long *)pdVar24 = sVar28.value._8_8_;
              }
              else {
                if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_c8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_d8,&local_c8);
                  p_Var12 = p_Stack_d0;
                  peVar11 = local_d8;
                  local_d8 = (element_type *)0x0;
                  p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar11;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var12;
                  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                  }
                  if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
                  }
                  pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar14->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar10 = (byte)uVar23 & 0x3f;
                puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                         + (uVar23 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
              }
              uVar23 = uVar23 + 1;
              pdVar24 = pdVar24 + 0x10;
            } while (count != uVar23);
          }
          if (local_c0.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_78.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        return;
      }
      paVar6 = (anon_union_16_2_67f50693_for_value *)vector->data;
      puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar24 = vector_00->data;
      if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar22 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (count == 0) {
            return;
          }
          aVar27 = paVar6->pointer;
          pdVar22 = pdVar22 + 8;
          iVar20 = 0;
          do {
            sVar28 = BinaryLambdaWrapper::
                     Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,(string_t)aVar27,
                                *(int *)(pdVar24 + iVar20 * 4),in_R8,in_R9);
            *(long *)(pdVar22 + -8) = sVar28.value._0_8_;
            *(long *)pdVar22 = sVar28.value._8_8_;
            iVar20 = iVar20 + 1;
            pdVar22 = pdVar22 + 0x10;
          } while (count != iVar20);
          return;
        }
        if (count + 0x3f < 0x40) {
          return;
        }
        uVar15 = 0;
        uVar23 = 0;
        do {
          puVar5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            uVar21 = 0xffffffffffffffff;
          }
          else {
            uVar21 = puVar5[uVar15];
          }
          uVar17 = uVar23 + 0x40;
          if (count <= uVar23 + 0x40) {
            uVar17 = count;
          }
          uVar18 = uVar17;
          if (uVar21 != 0) {
            uVar18 = uVar23;
            if (uVar21 == 0xffffffffffffffff) {
              if (uVar23 < uVar17) {
                aVar27 = paVar6->pointer;
                pdVar26 = pdVar22 + uVar23 * 0x10 + 8;
                do {
                  sVar28 = BinaryLambdaWrapper::
                           Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,(string_t)aVar27,
                                      *(int *)(pdVar24 + uVar18 * 4),in_R8,in_R9);
                  *(long *)(pdVar26 + -8) = sVar28.value._0_8_;
                  *(long *)pdVar26 = sVar28.value._8_8_;
                  uVar18 = uVar18 + 1;
                  pdVar26 = pdVar26 + 0x10;
                } while (uVar17 != uVar18);
              }
            }
            else if (uVar23 < uVar17) {
              pdVar26 = pdVar22 + uVar23 * 0x10 + 8;
              uVar18 = 0;
              do {
                if ((uVar21 >> (uVar18 & 0x3f) & 1) != 0) {
                  sVar28 = BinaryLambdaWrapper::
                           Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,(string_t)paVar6->pointer,
                                      *(int *)(pdVar24 + uVar18 * 4 + uVar23 * 4),in_R8,in_R9);
                  *(long *)(pdVar26 + -8) = sVar28.value._0_8_;
                  *(long *)pdVar26 = sVar28.value._8_8_;
                }
                uVar18 = uVar18 + 1;
                pdVar26 = pdVar26 + 0x10;
              } while ((uVar23 - uVar17) + uVar18 != 0);
              uVar18 = uVar23 + uVar18;
            }
          }
          uVar15 = uVar15 + 1;
          uVar23 = uVar18;
        } while (uVar15 != count + 0x3f >> 6);
        return;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void BitStringFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	BinaryExecutor::Execute<string_t, int32_t, string_t>(
	    args.data[0], args.data[1], result, args.size(), [&](string_t input, int32_t n) {
		    if (n < 0) {
			    throw InvalidInputException("The bitstring length cannot be negative");
		    }
		    idx_t input_length;
		    if (FROM_STRING) {
			    input_length = input.GetSize();
		    } else {
			    input_length = Bit::BitLength(input);
		    }
		    if (idx_t(n) < input_length) {
			    throw InvalidInputException("Length must be equal or larger than input string");
		    }
		    idx_t len;
		    if (FROM_STRING) {
			    Bit::TryGetBitStringSize(input, len, nullptr); // string verification
		    }

		    len = Bit::ComputeBitstringLen(UnsafeNumericCast<idx_t>(n));
		    string_t target = StringVector::EmptyString(result, len);
		    if (FROM_STRING) {
			    Bit::BitString(input, UnsafeNumericCast<idx_t>(n), target);
		    } else {
			    Bit::ExtendBitString(input, UnsafeNumericCast<idx_t>(n), target);
		    }
		    target.Finalize();
		    return target;
	    });
}